

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u64.c
# Opt level: O0

u64 u64Bitrev(u64 w)

{
  ulong uVar1;
  u64 w_local;
  
  uVar1 = w >> 1 & 0x5555555555555555 | (w & 0x5555555555555555) << 1;
  uVar1 = uVar1 >> 2 & 0x3333333333333333 | (uVar1 & 0x3333333333333333) << 2;
  uVar1 = uVar1 >> 4 & 0xf0f0f0f0f0f0f0f | (uVar1 & 0xf0f0f0f0f0f0f0f) << 4;
  uVar1 = uVar1 >> 8 & 0xff00ff00ff00ff | (uVar1 & 0xff00ff00ff00ff) << 8;
  uVar1 = uVar1 >> 0x10 & 0xffff0000ffff | (uVar1 & 0xffff0000ffff) << 0x10;
  return uVar1 >> 0x20 | uVar1 << 0x20;
}

Assistant:

u64 u64Bitrev(register u64 w)
{
	w = ((w >> 1 ) & 0x5555555555555555) | ((w & 0x5555555555555555) << 1);
	w = ((w >> 2 ) & 0x3333333333333333) | ((w & 0x3333333333333333) << 2);
	w = ((w >> 4 ) & 0x0F0F0F0F0F0F0F0F) | ((w & 0x0F0F0F0F0F0F0F0F) << 4);
	w = ((w >> 8 ) & 0x00FF00FF00FF00FF) | ((w & 0x00FF00FF00FF00FF) << 8);
	w = ((w >> 16) & 0x0000FFFF0000FFFF) | ((w & 0x0000FFFF0000FFFF) << 16);
	w = (w >> 32) | (w << 32);
	return w;
}